

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::is2DTrilinearFilterResultValid
               (LookupPrecision *prec,ColorQuad *quad0,ColorQuad *quad1,Vec2 *xBounds0,
               Vec2 *yBounds0,Vec2 *xBounds1,Vec2 *yBounds1,Vec2 *zBounds,float searchStep,
               Vec4 *result)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float in_XMM1_Da;
  float fVar20;
  float fVar21;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float fVar22;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float fVar23;
  float in_XMM7_Da;
  float fVar24;
  float fVar25;
  Vec4 c1;
  Vec4 c0;
  undefined1 local_1d8 [16];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  Vec4 local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  bVar17 = isInColorBounds(prec,quad0,quad1,(Vec4 *)xBounds0);
  if ((bVar17) && (searchStep < in_XMM1_Da + result._0_4_)) {
    uVar1 = *(undefined8 *)(quad0->p00).m_data;
    uVar2 = *(undefined8 *)((quad0->p00).m_data + 2);
    uVar3 = *(undefined8 *)(quad0->p01).m_data;
    uVar4 = *(undefined8 *)((quad0->p01).m_data + 2);
    uVar5 = *(undefined8 *)(quad0->p10).m_data;
    uVar6 = *(undefined8 *)((quad0->p10).m_data + 2);
    uVar7 = *(undefined8 *)(quad0->p11).m_data;
    uVar8 = *(undefined8 *)((quad0->p11).m_data + 2);
    uVar9 = *(undefined8 *)(quad1->p00).m_data;
    uVar10 = *(undefined8 *)((quad1->p00).m_data + 2);
    uVar11 = *(undefined8 *)(quad1->p01).m_data;
    uVar12 = *(undefined8 *)((quad1->p01).m_data + 2);
    uVar13 = *(undefined8 *)(quad1->p10).m_data;
    uVar14 = *(undefined8 *)((quad1->p10).m_data + 2);
    uVar15 = *(undefined8 *)(quad1->p11).m_data;
    uVar16 = *(undefined8 *)((quad1->p11).m_data + 2);
    do {
      if (in_XMM2_Da < in_XMM3_Da + result._0_4_) {
        fVar23 = (float)(~-(uint)(searchStep <= in_XMM1_Da) & (uint)in_XMM1_Da |
                        -(uint)(searchStep <= in_XMM1_Da) & (uint)searchStep);
        fVar24 = 1.0 - fVar23;
        local_158 = (float)uVar1;
        fStack_154 = (float)((ulong)uVar1 >> 0x20);
        fStack_150 = (float)uVar2;
        fStack_14c = (float)((ulong)uVar2 >> 0x20);
        local_178 = (float)uVar5;
        fStack_174 = (float)((ulong)uVar5 >> 0x20);
        fStack_170 = (float)uVar6;
        fStack_16c = (float)((ulong)uVar6 >> 0x20);
        local_168 = (float)uVar3;
        fStack_164 = (float)((ulong)uVar3 >> 0x20);
        fStack_160 = (float)uVar4;
        fStack_15c = (float)((ulong)uVar4 >> 0x20);
        local_188 = (float)uVar7;
        fStack_184 = (float)((ulong)uVar7 >> 0x20);
        fStack_180 = (float)uVar8;
        fStack_17c = (float)((ulong)uVar8 >> 0x20);
        fVar25 = in_XMM2_Da;
        do {
          fVar18 = (float)(~-(uint)(fVar25 <= in_XMM3_Da) & (uint)in_XMM3_Da |
                          -(uint)(fVar25 <= in_XMM3_Da) & (uint)fVar25);
          fVar20 = 1.0 - fVar18;
          local_38 = fVar18 * fVar23 * local_188 +
                     fVar18 * fVar24 * local_168 +
                     fVar20 * fVar23 * local_178 + fVar20 * fVar24 * local_158;
          fStack_34 = fVar18 * fVar23 * fStack_184 +
                      fVar18 * fVar24 * fStack_164 +
                      fVar20 * fVar23 * fStack_174 + fVar20 * fVar24 * fStack_154;
          fStack_30 = fVar18 * fVar23 * fStack_180 +
                      fVar18 * fVar24 * fStack_160 +
                      fVar20 * fVar23 * fStack_170 + fVar20 * fVar24 * fStack_150;
          fStack_2c = fVar18 * fVar23 * fStack_17c +
                      fVar18 * fVar24 * fStack_15c +
                      fVar20 * fVar23 * fStack_16c + fVar20 * fVar24 * fStack_14c;
          if (in_XMM4_Da <= in_XMM5_Da) {
            local_1d8 = ZEXT416((uint)in_XMM4_Da);
            do {
              if (in_XMM6_Da <= in_XMM7_Da) {
                fVar22 = (float)(~-(uint)((float)local_1d8._0_4_ <= in_XMM5_Da) & (uint)in_XMM5_Da |
                                -(uint)((float)local_1d8._0_4_ <= in_XMM5_Da) & local_1d8._0_4_);
                fVar20 = 1.0 - fVar22;
                local_c8 = (float)uVar9;
                fStack_c4 = (float)((ulong)uVar9 >> 0x20);
                fStack_c0 = (float)uVar10;
                fStack_bc = (float)((ulong)uVar10 >> 0x20);
                local_e8 = (float)uVar13;
                fStack_e4 = (float)((ulong)uVar13 >> 0x20);
                fStack_e0 = (float)uVar14;
                fStack_dc = (float)((ulong)uVar14 >> 0x20);
                local_d8 = (float)uVar11;
                fStack_d4 = (float)((ulong)uVar11 >> 0x20);
                fStack_d0 = (float)uVar12;
                fStack_cc = (float)((ulong)uVar12 >> 0x20);
                local_f8 = (float)uVar15;
                fStack_f4 = (float)((ulong)uVar15 >> 0x20);
                fStack_f0 = (float)uVar16;
                fStack_ec = (float)((ulong)uVar16 >> 0x20);
                fVar18 = in_XMM6_Da;
                do {
                  fVar19 = (float)(~-(uint)(fVar18 <= in_XMM7_Da) & (uint)in_XMM7_Da |
                                  -(uint)(fVar18 <= in_XMM7_Da) & (uint)fVar18);
                  fVar21 = 1.0 - fVar19;
                  local_48.m_data[0] =
                       fVar19 * fVar22 * local_f8 +
                       fVar19 * fVar20 * local_d8 +
                       fVar21 * fVar22 * local_e8 + fVar21 * fVar20 * local_c8;
                  local_48.m_data[1] =
                       fVar19 * fVar22 * fStack_f4 +
                       fVar19 * fVar20 * fStack_d4 +
                       fVar21 * fVar22 * fStack_e4 + fVar21 * fVar20 * fStack_c4;
                  local_48.m_data[2] =
                       fVar19 * fVar22 * fStack_f0 +
                       fVar19 * fVar20 * fStack_d0 +
                       fVar21 * fVar22 * fStack_e0 + fVar21 * fVar20 * fStack_c0;
                  local_48.m_data[3] =
                       fVar19 * fVar22 * fStack_ec +
                       fVar19 * fVar20 * fStack_cc +
                       fVar21 * fVar22 * fStack_dc + fVar21 * fVar20 * fStack_bc;
                  bVar17 = isLinearRangeValid((tcu *)prec,(LookupPrecision *)&local_38,&local_48,
                                              (Vec4 *)xBounds0,yBounds0,(Vec4 *)xBounds1);
                  if (bVar17) {
                    return true;
                  }
                  fVar18 = fVar18 + result._0_4_;
                } while (fVar18 <= in_XMM7_Da);
              }
              local_1d8._0_4_ = (float)local_1d8._0_4_ + result._0_4_;
            } while ((float)local_1d8._0_4_ <= in_XMM5_Da);
          }
          fVar25 = fVar25 + result._0_4_;
        } while (fVar25 < in_XMM3_Da + result._0_4_);
      }
      searchStep = searchStep + result._0_4_;
    } while (searchStep < in_XMM1_Da + result._0_4_);
  }
  return false;
}

Assistant:

static bool is2DTrilinearFilterResultValid (const LookupPrecision&	prec,
											const ColorQuad&		quad0,
											const ColorQuad&		quad1,
											const Vec2&				xBounds0,
											const Vec2&				yBounds0,
											const Vec2&				xBounds1,
											const Vec2&				yBounds1,
											const Vec2&				zBounds,
											const float				searchStep,
											const Vec4&				result)
{
	DE_ASSERT(xBounds0.x() <= xBounds0.y());
	DE_ASSERT(yBounds0.x() <= yBounds0.y());
	DE_ASSERT(xBounds1.x() <= xBounds1.y());
	DE_ASSERT(yBounds1.x() <= yBounds1.y());
	DE_ASSERT(xBounds0.x() + searchStep > xBounds0.x()); // step is not effectively 0
	DE_ASSERT(xBounds0.y() + searchStep > xBounds0.y());
	DE_ASSERT(yBounds0.x() + searchStep > yBounds0.x());
	DE_ASSERT(yBounds0.y() + searchStep > yBounds0.y());
	DE_ASSERT(xBounds1.x() + searchStep > xBounds1.x());
	DE_ASSERT(xBounds1.y() + searchStep > xBounds1.y());
	DE_ASSERT(yBounds1.x() + searchStep > yBounds1.x());
	DE_ASSERT(yBounds1.y() + searchStep > yBounds1.y());

	if (!isInColorBounds(prec, quad0, quad1, result))
		return false;

	for (float x0 = xBounds0.x(); x0 < xBounds0.y()+searchStep; x0 += searchStep)
	{
		for (float y0 = yBounds0.x(); y0 < yBounds0.y()+searchStep; y0 += searchStep)
		{
			const float		a0	= de::min(x0, xBounds0.y());
			const float		b0	= de::min(y0, yBounds0.y());
			const Vec4		c0	= quad0.p00*(1.0f-a0)*(1.0f-b0) + quad0.p10*a0*(1.0f-b0) + quad0.p01*(1.0f-a0)*b0 + quad0.p11*a0*b0;

			for (float x1 = xBounds1.x(); x1 <= xBounds1.y(); x1 += searchStep)
			{
				for (float y1 = yBounds1.x(); y1 <= yBounds1.y(); y1 += searchStep)
				{
					const float		a1	= de::min(x1, xBounds1.y());
					const float		b1	= de::min(y1, yBounds1.y());
					const Vec4		c1	= quad1.p00*(1.0f-a1)*(1.0f-b1) + quad1.p10*a1*(1.0f-b1) + quad1.p01*(1.0f-a1)*b1 + quad1.p11*a1*b1;

					if (isLinearRangeValid(prec, c0, c1, zBounds, result))
						return true;
				}
			}
		}
	}

	return false;
}